

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_threaded_clusterizer.h
# Opt level: O3

void __thiscall
crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::compute_pca
          (threaded_clusterizer<crnlib::vec<16U,_float>_> *this,vec<16U,_float> *axis_res,
          vec<16U,_float> *centroid_res,weighted_vec_array *vecs,vector<unsigned_int> *indices)

{
  undefined8 uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint *puVar5;
  weighted_vec *pwVar6;
  double dVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  uint i_2;
  int iVar13;
  float *pfVar14;
  float *pfVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 *puVar18;
  long lVar19;
  long lVar20;
  float *pfVar21;
  uint x;
  long lVar22;
  float fVar23;
  vec<16U,_float> axis;
  vec<16U,_float> centroid;
  vec<16U,_float> prev_axis;
  vec<16U,_float> x_2;
  vec<16U,_float> delta_axis;
  matrix<16U,_16U,_float> covar;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  double local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float local_470 [272];
  
  local_588._0_4_ = 0.0;
  local_588._4_4_ = 0.0;
  uStack_580._0_4_ = 0.0;
  uStack_580._4_4_ = 0.0;
  local_518 = 0;
  uStack_510 = 0;
  local_528 = 0;
  uStack_520 = 0;
  local_538 = 0;
  uStack_530 = 0;
  local_548 = 0;
  uStack_540 = 0;
  uVar17 = (ulong)indices->m_size;
  if (uVar17 != 0) {
    puVar5 = indices->m_p;
    pwVar6 = vecs->m_p;
    local_4c8 = 0.0;
    uVar16 = 0;
    do {
      uVar3 = puVar5[uVar16];
      uVar4 = pwVar6[uVar3].m_weight;
      fVar23 = (float)uVar4;
      lVar20 = 0;
      do {
        pfVar14 = pwVar6[uVar3].m_vec.m_s + lVar20;
        fVar8 = pfVar14[1];
        fVar9 = pfVar14[2];
        fVar10 = pfVar14[3];
        local_470[lVar20 + 0x10] = *pfVar14 * fVar23;
        local_470[lVar20 + 0x11] = fVar8 * fVar23;
        local_470[lVar20 + 0x12] = fVar9 * fVar23;
        local_470[lVar20 + 0x13] = fVar10 * fVar23;
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x10);
      lVar20 = 0;
      do {
        fVar23 = local_470[lVar20 + 0x11];
        fVar8 = local_470[lVar20 + 0x12];
        fVar9 = local_470[lVar20 + 0x13];
        lVar22 = lVar20 * 4;
        fVar10 = *(float *)((long)&local_548 + lVar22 + 4);
        fVar11 = *(float *)((long)&uStack_540 + lVar22);
        fVar12 = *(float *)((long)&uStack_540 + lVar22 + 4);
        lVar19 = lVar20 * 4;
        *(float *)((long)&local_548 + lVar19) =
             *(float *)((long)&local_548 + lVar22) + local_470[lVar20 + 0x10];
        *(float *)((long)&local_548 + lVar19 + 4) = fVar10 + fVar23;
        *(float *)((long)&uStack_540 + lVar19) = fVar11 + fVar8;
        *(float *)((long)&uStack_540 + lVar19 + 4) = fVar12 + fVar9;
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x10);
      local_4c8 = local_4c8 + (double)uVar4;
      uVar16 = uVar16 + 1;
    } while (uVar16 != uVar17);
    if ((local_4c8 != 0.0) || (NAN(local_4c8))) {
      local_4c8 = 1.0 / local_4c8;
      uStack_4c0 = 0;
      lVar20 = 0;
      do {
        uVar1 = *(undefined8 *)((long)&uStack_540 + lVar20 * 4);
        uVar2 = *(undefined8 *)((long)&local_548 + lVar20 * 4);
        lVar22 = lVar20 * 4;
        *(float *)((long)&local_548 + lVar22) = (float)((double)(float)uVar2 * local_4c8);
        *(float *)((long)&local_548 + lVar22 + 4) =
             (float)((double)(float)((ulong)uVar2 >> 0x20) * local_4c8);
        *(float *)((long)&uStack_540 + lVar22) = (float)((double)(float)uVar1 * local_4c8);
        *(float *)((long)&uStack_540 + lVar22 + 4) =
             (float)((double)(float)((ulong)uVar1 >> 0x20) * local_4c8);
        lVar20 = lVar20 + 4;
      } while (lVar20 != 0x10);
      memset(local_470 + 0x10,0,0x400);
      if (uVar17 != 0) {
        puVar5 = indices->m_p;
        pwVar6 = vecs->m_p;
        uVar16 = 0;
        do {
          uVar3 = puVar5[uVar16];
          lVar20 = 0;
          do {
            pfVar14 = pwVar6[uVar3].m_vec.m_s + lVar20;
            fVar23 = pfVar14[1];
            fVar8 = pfVar14[2];
            fVar9 = pfVar14[3];
            lVar19 = lVar20 * 4;
            fVar10 = *(float *)((long)&local_548 + lVar19 + 4);
            fVar11 = *(float *)((long)&uStack_540 + lVar19);
            fVar12 = *(float *)((long)&uStack_540 + lVar19 + 4);
            lVar22 = lVar20 * 4;
            *(float *)((long)&local_588 + lVar22) = *pfVar14 - *(float *)((long)&local_548 + lVar19)
            ;
            *(float *)((long)&local_588 + lVar22 + 4) = fVar23 - fVar10;
            *(float *)((long)&uStack_580 + lVar22) = fVar8 - fVar11;
            *(float *)((long)&uStack_580 + lVar22 + 4) = fVar9 - fVar12;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          fVar23 = (float)pwVar6[uVar3].m_weight;
          lVar20 = 0;
          do {
            lVar22 = lVar20 * 4;
            fVar8 = *(float *)((long)&local_588 + lVar22 + 4);
            fVar9 = *(float *)((long)&uStack_580 + lVar22);
            fVar10 = *(float *)((long)&uStack_580 + lVar22 + 4);
            lVar19 = lVar20 * 4;
            *(float *)((long)&local_508 + lVar19) = *(float *)((long)&local_588 + lVar22) * fVar23;
            *(float *)((long)&local_508 + lVar19 + 4) = fVar8 * fVar23;
            *(float *)((long)&uStack_500 + lVar19) = fVar9 * fVar23;
            *(float *)((long)&uStack_500 + lVar19 + 4) = fVar10 * fVar23;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
          lVar20 = 0;
          puVar18 = &local_508;
          pfVar14 = local_470 + 0x10;
          do {
            fVar23 = *(float *)((long)&local_588 + lVar20 * 4);
            lVar22 = -0x10;
            do {
              pfVar14[lVar22 + 0x10] =
                   *(float *)((long)puVar18 + lVar22 * 4 + 0x40) * fVar23 + pfVar14[lVar22 + 0x10];
              lVar22 = lVar22 + 1;
            } while (lVar20 + lVar22 != 0);
            lVar20 = lVar20 + 1;
            pfVar14 = pfVar14 + 0x11;
            puVar18 = (undefined8 *)((long)puVar18 + 4);
          } while (lVar20 != 0x10);
          uVar16 = uVar16 + 1;
        } while (uVar16 != uVar17);
      }
      pfVar14 = local_470 + 0x10;
      lVar20 = 0;
      do {
        lVar22 = -0x10;
        do {
          pfVar14[lVar22 + 0x10] = (float)((double)pfVar14[lVar22 + 0x10] * local_4c8);
          lVar22 = lVar22 + 1;
        } while (lVar20 + lVar22 != 0);
        lVar20 = lVar20 + 1;
        pfVar14 = pfVar14 + 0x11;
      } while (lVar20 != 0x10);
      pfVar15 = local_470;
      pfVar14 = local_470 + 0x20;
      lVar20 = 0;
      do {
        pfVar15 = pfVar15 + 0x11;
        lVar22 = lVar20 + 1;
        lVar19 = -0xf;
        pfVar21 = pfVar14;
        do {
          *pfVar21 = pfVar15[lVar19 + 0xf];
          lVar19 = lVar19 + 1;
          pfVar21 = pfVar21 + 0x10;
        } while (lVar20 + lVar19 != 0);
        pfVar14 = pfVar14 + 0x11;
        lVar20 = lVar22;
      } while (lVar22 != 0xf);
      local_588 = 0x3f4888893f400000;
      uStack_580 = 0x3f59999a3f511111;
      local_578 = 0x3f6aaaab3f622222;
      uStack_570 = 0x3f7bbbbc3f733334;
      local_568 = 0x3f8666663f822222;
      uStack_560 = 0x3f8eeeef3f8aaaab;
      local_558 = 0x3f9777783f933334;
      uStack_550 = 0x3fa000003f9bbbbc;
      local_4d8 = 0x3f9777783f933334;
      uStack_4d0 = 0x3fa000003f9bbbbc;
      local_4e8 = 0x3f8666663f822222;
      uStack_4e0 = 0x3f8eeeef3f8aaaab;
      local_4f8 = 0x3f6aaaab3f622222;
      uStack_4f0 = 0x3f7bbbbc3f733334;
      local_508 = 0x3f4888893f400000;
      uStack_500 = 0x3f59999a3f511111;
      iVar13 = 0;
      do {
        lVar20 = 0;
        fVar23 = 0.0;
        pfVar14 = local_470;
        do {
          pfVar14 = pfVar14 + 0x10;
          fVar8 = 0.0;
          lVar22 = 0;
          do {
            fVar8 = fVar8 + *(float *)((long)&local_588 + lVar22 * 4) * pfVar14[lVar22];
            lVar22 = lVar22 + 1;
          } while (lVar22 != 0x10);
          *(float *)((long)&local_4b0 + lVar20 * 4) = fVar8;
          if (fVar23 <= ABS(fVar8)) {
            fVar23 = ABS(fVar8);
          }
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
        if ((fVar23 != 0.0) || (NAN(fVar23))) {
          fVar23 = 1.0 / fVar23;
          lVar20 = 0;
          do {
            lVar22 = lVar20 * 4;
            fVar8 = *(float *)((long)&local_4b0 + lVar22 + 4);
            fVar9 = *(float *)((long)&uStack_4a8 + lVar22);
            fVar10 = *(float *)((long)&uStack_4a8 + lVar22 + 4);
            lVar19 = lVar20 * 4;
            *(float *)((long)&local_4b0 + lVar19) = *(float *)((long)&local_4b0 + lVar22) * fVar23;
            *(float *)((long)&local_4b0 + lVar19 + 4) = fVar8 * fVar23;
            *(float *)((long)&uStack_4a8 + lVar19) = fVar9 * fVar23;
            *(float *)((long)&uStack_4a8 + lVar19 + 4) = fVar10 * fVar23;
            lVar20 = lVar20 + 4;
          } while (lVar20 != 0x10);
        }
        lVar20 = 0;
        do {
          lVar22 = lVar20 * 4;
          fVar23 = *(float *)((long)&local_508 + lVar22 + 4);
          fVar8 = *(float *)((long)&uStack_500 + lVar22);
          fVar9 = *(float *)((long)&uStack_500 + lVar22 + 4);
          lVar19 = lVar20 * 4;
          fVar10 = *(float *)((long)&local_4b0 + lVar19 + 4);
          fVar11 = *(float *)((long)&uStack_4a8 + lVar19);
          fVar12 = *(float *)((long)&uStack_4a8 + lVar19 + 4);
          local_470[lVar20] =
               *(float *)((long)&local_508 + lVar22) - *(float *)((long)&local_4b0 + lVar19);
          local_470[lVar20 + 1] = fVar23 - fVar10;
          local_470[lVar20 + 2] = fVar8 - fVar11;
          local_470[lVar20 + 3] = fVar9 - fVar12;
          lVar20 = lVar20 + 4;
        } while (lVar20 != 0x10);
        local_4d8 = local_558;
        uStack_4d0 = uStack_550;
        local_4e8 = local_568;
        uStack_4e0 = uStack_560;
        local_4f8 = local_578;
        uStack_4f0 = uStack_570;
        local_508 = local_588;
        uStack_500 = uStack_580;
        local_588 = local_4b0;
        uVar1 = local_588;
        uStack_580 = uStack_4a8;
        local_578 = local_4a0;
        uStack_570 = uStack_498;
        local_568 = local_490;
        uStack_560 = uStack_488;
        local_558 = local_480;
        uStack_550 = uStack_478;
        fVar23 = local_470[0] * local_470[0];
        lVar20 = 1;
        do {
          fVar23 = fVar23 + local_470[lVar20] * local_470[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar20 != 0x10);
      } while ((0.0025 <= fVar23) && (iVar13 = iVar13 + 1, iVar13 != 10));
      local_588._0_4_ = (float)local_4b0;
      dVar7 = (double)((float)local_588 * (float)local_588);
      lVar20 = 1;
      do {
        fVar23 = *(float *)((long)&local_588 + lVar20 * 4);
        dVar7 = dVar7 + (double)(fVar23 * fVar23);
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x10);
      local_588 = uVar1;
      if ((dVar7 != 0.0) || (NAN(dVar7))) {
        if (dVar7 < 0.0) {
          dVar7 = sqrt(dVar7);
        }
        else {
          dVar7 = SQRT(dVar7);
        }
        fVar23 = (float)(1.0 / dVar7);
        lVar20 = 0;
        do {
          lVar22 = lVar20 * 4;
          fVar8 = *(float *)((long)&local_588 + lVar22 + 4);
          fVar9 = *(float *)((long)&uStack_580 + lVar22);
          fVar10 = *(float *)((long)&uStack_580 + lVar22 + 4);
          lVar19 = lVar20 * 4;
          *(float *)((long)&local_588 + lVar19) = *(float *)((long)&local_588 + lVar22) * fVar23;
          *(float *)((long)&local_588 + lVar19 + 4) = fVar8 * fVar23;
          *(float *)((long)&uStack_580 + lVar19) = fVar9 * fVar23;
          *(float *)((long)&uStack_580 + lVar19 + 4) = fVar10 * fVar23;
          lVar20 = lVar20 + 4;
        } while (lVar20 != 0x10);
      }
      *(undefined8 *)(axis_res->m_s + 0xc) = local_558;
      *(undefined8 *)(axis_res->m_s + 0xe) = uStack_550;
      *(undefined8 *)(axis_res->m_s + 8) = local_568;
      *(undefined8 *)(axis_res->m_s + 10) = uStack_560;
      *(undefined8 *)(axis_res->m_s + 4) = local_578;
      *(undefined8 *)(axis_res->m_s + 6) = uStack_570;
      goto LAB_00149404;
    }
  }
  axis_res->m_s[0xc] = 0.0;
  axis_res->m_s[0xd] = 0.0;
  axis_res->m_s[0xe] = 0.0;
  axis_res->m_s[0xf] = 0.0;
  axis_res->m_s[8] = 0.0;
  axis_res->m_s[9] = 0.0;
  axis_res->m_s[10] = 0.0;
  axis_res->m_s[0xb] = 0.0;
  axis_res->m_s[4] = 0.0;
  axis_res->m_s[5] = 0.0;
  axis_res->m_s[6] = 0.0;
  axis_res->m_s[7] = 0.0;
LAB_00149404:
  axis_res->m_s[0] = (float)local_588;
  axis_res->m_s[1] = local_588._4_4_;
  axis_res->m_s[2] = (float)uStack_580;
  axis_res->m_s[3] = uStack_580._4_4_;
  *(undefined8 *)(centroid_res->m_s + 0xc) = local_518;
  *(undefined8 *)(centroid_res->m_s + 0xe) = uStack_510;
  *(undefined8 *)(centroid_res->m_s + 8) = local_528;
  *(undefined8 *)(centroid_res->m_s + 10) = uStack_520;
  *(undefined8 *)(centroid_res->m_s + 4) = local_538;
  *(undefined8 *)(centroid_res->m_s + 6) = uStack_530;
  *(undefined8 *)centroid_res->m_s = local_548;
  *(undefined8 *)(centroid_res->m_s + 2) = uStack_540;
  return;
}

Assistant:

void compute_pca(VectorType& axis_res, VectorType& centroid_res, const weighted_vec_array& vecs, const vector<uint>& indices) {
    const uint N = VectorType::num_elements;

    VectorType centroid(0.0f);
    double total_weight = 0.0f;
    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& v = vecs[indices[i]];
      centroid += v.m_vec * static_cast<float>(v.m_weight);
      total_weight += v.m_weight;
    }

    if (total_weight == 0.0f) {
      axis_res.clear();
      centroid_res = centroid;
      return;
    }

    double one_over_total_weight = 1.0f / total_weight;
    for (uint i = 0; i < N; i++)
      centroid[i] = static_cast<float>(centroid[i] * one_over_total_weight);

    matrix<N, N, float> covar;
    covar.clear();

    for (uint i = 0; i < indices.size(); i++) {
      const weighted_vec& weighted_vec = vecs[indices[i]];

      const VectorType v(weighted_vec.m_vec - centroid);
      const VectorType w(v * static_cast<float>(weighted_vec.m_weight));

      for (uint x = 0; x < N; x++)
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
    }

    for (uint x = 0; x < N; x++)
      for (uint y = x; y < N; y++)
        covar[x][y] = static_cast<float>(covar[x][y] * one_over_total_weight);

    for (uint x = 0; x < (N - 1); x++)
      for (uint y = x + 1; y < N; y++)
        covar[y][x] = covar[x][y];

    VectorType axis;
    for (uint i = 0; i < N; i++)
      axis[i] = math::lerp(.75f, 1.25f, i * (1.0f / (N - 1)));

    VectorType prev_axis(axis);

    const uint cMaxIterations = 10;
    for (uint iter = 0; iter < cMaxIterations; iter++) {
      VectorType x;

      double max_sum = 0;

      for (uint i = 0; i < N; i++) {
        double sum = 0;

        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];

        x[i] = static_cast<float>(sum);

        max_sum = math::maximum(max_sum, fabs(sum));
      }

      if (max_sum != 0.0f)
        x *= static_cast<float>(1.0f / max_sum);

      VectorType delta_axis(prev_axis - x);

      prev_axis = axis;
      axis = x;

      if (delta_axis.norm() < .0025f)
        break;
    }

    axis.normalize();

    axis_res = axis;
    centroid_res = centroid;
  }